

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

bool btGeneric6DofSpring2Constraint::matrixToEulerXZY(btMatrix3x3 *mat,btVector3 *xyz)

{
  bool bVar1;
  float fVar2;
  btScalar bVar3;
  
  fVar2 = mat->m_el[1].m_floats[0];
  if (1.0 <= fVar2) {
    fVar2 = atan2f(-mat->m_el[0].m_floats[2],mat->m_el[2].m_floats[2]);
    xyz->m_floats[0] = fVar2;
    xyz->m_floats[1] = 0.0;
    bVar3 = -1.5707964;
  }
  else {
    if (-1.0 < fVar2) {
      fVar2 = atan2f(mat->m_el[1].m_floats[2],mat->m_el[1].m_floats[1]);
      xyz->m_floats[0] = fVar2;
      fVar2 = atan2f(mat->m_el[2].m_floats[0],mat->m_el[0].m_floats[0]);
      xyz->m_floats[1] = fVar2;
      bVar3 = btAsin(-mat->m_el[1].m_floats[0]);
      bVar1 = true;
      goto LAB_00171b10;
    }
    fVar2 = atan2f(-mat->m_el[0].m_floats[2],mat->m_el[2].m_floats[2]);
    xyz->m_floats[0] = -fVar2;
    xyz->m_floats[1] = 0.0;
    bVar3 = 1.5707964;
  }
  bVar1 = false;
LAB_00171b10:
  xyz->m_floats[2] = bVar3;
  return bVar1;
}

Assistant:

bool btGeneric6DofSpring2Constraint::matrixToEulerXZY(const btMatrix3x3& mat,btVector3& xyz)
{
	// rot =  cy*cz          -sz           sy*cz
	//        cy*cx*sz+sx*sy  cx*cz        sy*cx*sz-cy*sx
	//        cy*sx*sz-cx*sy  sx*cz        sy*sx*sz+cx*cy

	btScalar fi = btGetMatrixElem(mat,1);
	if (fi < btScalar(1.0f))
	{
		if (fi > btScalar(-1.0f))
		{
			xyz[0] = btAtan2(btGetMatrixElem(mat,7),btGetMatrixElem(mat,4));
			xyz[1] = btAtan2(btGetMatrixElem(mat,2),btGetMatrixElem(mat,0));
			xyz[2] = btAsin(-btGetMatrixElem(mat,1));
			return true;
		}
		else
		{
			xyz[0] = -btAtan2(-btGetMatrixElem(mat,6),btGetMatrixElem(mat,8));
			xyz[1] = btScalar(0.0);
			xyz[2] = SIMD_HALF_PI;
			return false;
		}
	}
	else
	{
		xyz[0] = btAtan2(-btGetMatrixElem(mat,6),btGetMatrixElem(mat,8));
		xyz[1] = 0.0;
		xyz[2] = -SIMD_HALF_PI;
	}
	return false;
}